

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QGraphicsItem * __thiscall
QGraphicsItem::commonAncestorItem(QGraphicsItem *this,QGraphicsItem *other)

{
  QGraphicsItemPrivate *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (other == (QGraphicsItem *)0x0) {
    this = (QGraphicsItem *)0x0;
  }
  else if (other != this) {
    pQVar1 = (this->d_ptr).d;
    iVar4 = pQVar1->itemDepth;
    if (iVar4 == -1) {
      QGraphicsItemPrivate::resolveDepth(pQVar1);
      iVar4 = pQVar1->itemDepth;
    }
    pQVar1 = (other->d_ptr).d;
    iVar3 = pQVar1->itemDepth;
    iVar2 = iVar4;
    if (iVar3 == -1) {
      QGraphicsItemPrivate::resolveDepth(pQVar1);
      iVar3 = pQVar1->itemDepth;
    }
    for (; iVar3 < iVar4; iVar4 = iVar4 + -1) {
      this = ((this->d_ptr).d)->parent;
      iVar2 = iVar3;
    }
    for (; iVar2 < iVar3; iVar3 = iVar3 + -1) {
      other = ((other->d_ptr).d)->parent;
    }
    if (this != (QGraphicsItem *)0x0) {
      while ((this != other && (this = ((this->d_ptr).d)->parent, this != (QGraphicsItem *)0x0))) {
        other = ((other->d_ptr).d)->parent;
      }
    }
  }
  return this;
}

Assistant:

QGraphicsItem *QGraphicsItem::commonAncestorItem(const QGraphicsItem *other) const
{
    if (!other)
        return nullptr;
    if (other == this)
        return const_cast<QGraphicsItem *>(this);
    const QGraphicsItem *thisw = this;
    const QGraphicsItem *otherw = other;
    int thisDepth = d_ptr->depth();
    int otherDepth = other->d_ptr->depth();
    while (thisDepth > otherDepth) {
        thisw = thisw->d_ptr->parent;
        --thisDepth;
    }
    while (otherDepth > thisDepth) {
        otherw = otherw->d_ptr->parent;
        --otherDepth;
    }
    while (thisw && thisw != otherw) {
        thisw = thisw->d_ptr->parent;
        otherw = otherw->d_ptr->parent;
    }
    return const_cast<QGraphicsItem *>(thisw);
}